

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_ObjLabelTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,int fFirst)

{
  bool bVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int fHasNone;
  int Diff;
  int i;
  int iFanout;
  int fFirst_local;
  int nFanMax_local;
  int nTfoLevMax_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  bVar1 = false;
  p_local._4_4_ = Acb_ObjTravIdDiff(p,iObj);
  if (2 < p_local._4_4_) {
    Acb_ObjSetTravIdDiff(p,iObj,2);
    iVar2 = Acb_ObjIsCo(p,iObj);
    if ((iVar2 == 0) && (iVar2 = Acb_ObjLevelD(p,iObj), iVar2 <= nTfoLevMax)) {
      iVar2 = Acb_ObjLevelD(p,iObj);
      if ((iVar2 == nTfoLevMax) || (iVar2 = Acb_ObjFanoutNum(p,iObj), nFanMax < iVar2)) {
        if (p_local._4_4_ == 3) {
          Acb_ObjSetTravIdDiff(p,iObj,1);
        }
        p_local._4_4_ = Acb_ObjTravIdDiff(p,iObj);
      }
      else {
        fHasNone = 0;
        while( true ) {
          pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
          iVar2 = Vec_IntSize(pVVar5);
          if (iVar2 <= fHasNone) break;
          pVVar5 = Vec_WecEntry(&p->vFanouts,iObj);
          iVar2 = Vec_IntEntry(pVVar5,fHasNone);
          AVar3 = Acb_ObjType(p,iVar2);
          if ((AVar3 != ABC_OPER_NONE) &&
             ((fFirst == 0 || (iVar4 = Acb_ObjIsDelayCriticalFanin(p,iVar2,iObj), iVar4 != 0)))) {
            iVar2 = Acb_ObjLabelTfo_rec(p,iVar2,nTfoLevMax,nFanMax,0);
            bVar1 = (bool)(iVar2 == 2 | bVar1);
          }
          fHasNone = fHasNone + 1;
        }
        if ((bVar1) && (p_local._4_4_ == 3)) {
          Acb_ObjSetTravIdDiff(p,iObj,1);
        }
        else if (!bVar1) {
          Acb_ObjSetTravIdDiff(p,iObj,0);
        }
        p_local._4_4_ = Acb_ObjTravIdDiff(p,iObj);
      }
    }
    else {
      p_local._4_4_ = 2;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Acb_ObjLabelTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, int fFirst )
{
    int iFanout, i, Diff, fHasNone = 0;
    if ( (Diff = Acb_ObjTravIdDiff(p, iObj)) <= 2 )
        return Diff;
    Acb_ObjSetTravIdDiff( p, iObj, 2 );
    if ( Acb_ObjIsCo(p, iObj) || Acb_ObjLevelD(p, iObj) > nTfoLevMax )
        return 2;
    if ( Acb_ObjLevelD(p, iObj) == nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
    {
        if ( Diff == 3 )  // belongs to TFO of TFI
            Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
        return Acb_ObjTravIdDiff(p, iObj);
    }
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            fHasNone |= 2 == Acb_ObjLabelTfo_rec( p, iFanout, nTfoLevMax, nFanMax, 0 );
    if ( fHasNone && Diff == 3 )  // belongs to TFO of TFI
        Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
    else if ( !fHasNone )
        Acb_ObjSetTravIdDiff( p, iObj, 0 ); // inner
    return Acb_ObjTravIdDiff(p, iObj);
}